

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

bool __thiscall
duckdb::PerfectHashJoinExecutor::FillSelectionVectorSwitchBuild
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *sel_vec,
          SelectionVector *seq_sel_vec,idx_t count)

{
  PhysicalType PVar1;
  bool bVar2;
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  PVar1 = (source->type).physical_type_;
  switch(PVar1) {
  case UINT8:
    bVar2 = TemplatedFillSelectionVectorBuild<unsigned_char>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  case INT8:
    bVar2 = TemplatedFillSelectionVectorBuild<signed_char>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  case UINT16:
    bVar2 = TemplatedFillSelectionVectorBuild<unsigned_short>(this,source,sel_vec,seq_sel_vec,count)
    ;
    return bVar2;
  case INT16:
    bVar2 = TemplatedFillSelectionVectorBuild<short>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  case UINT32:
    bVar2 = TemplatedFillSelectionVectorBuild<unsigned_int>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  case INT32:
    bVar2 = TemplatedFillSelectionVectorBuild<int>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  case UINT64:
    bVar2 = TemplatedFillSelectionVectorBuild<unsigned_long>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  case INT64:
    bVar2 = TemplatedFillSelectionVectorBuild<long>(this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  }
  if (PVar1 == UINT128) {
    bVar2 = TemplatedFillSelectionVectorBuild<duckdb::uhugeint_t>
                      (this,source,sel_vec,seq_sel_vec,count);
    return bVar2;
  }
  if (PVar1 != INT128) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Type not supported for perfect hash join",&local_39);
    NotImplementedException::NotImplementedException(this_00,&local_38);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar2 = TemplatedFillSelectionVectorBuild<duckdb::hugeint_t>
                    (this,source,sel_vec,seq_sel_vec,count);
  return bVar2;
}

Assistant:

PerfectHashJoinState(ClientContext &context, const PhysicalHashJoin &join) : probe_executor(context) {
		join_keys.Initialize(Allocator::Get(context), join.condition_types);
		for (auto &cond : join.conditions) {
			probe_executor.AddExpression(*cond.left);
		}
		build_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		probe_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		seq_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
	}